

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

void l_print(lua_State *L)

{
  char *pname;
  int iVar1;
  char *pcVar2;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  if (0 < iVar1) {
    luaL_checkstack(L,0x14,"too many results to print");
    lua_getglobal(L,"print");
    lua_rotate(L,1,1);
    iVar1 = lua_pcallk(L,iVar1,0,0,0,(lua_KFunction)0x0);
    pname = progname;
    if (iVar1 != 0) {
      pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
      pcVar2 = lua_pushfstring(L,"error calling \'print\' (%s)",pcVar2);
      l_message(pname,pcVar2);
    }
  }
  return;
}

Assistant:

static void l_print(lua_State *L) {
    int n = lua_gettop(L);
    if (n > 0) {  /* any result to be printed? */
        luaL_checkstack(L, LUA_MINSTACK, "too many results to print");
        lua_getglobal(L, "print");
        lua_insert(L, 1);
        if (lua_pcall(L, n, 0, 0) != LUA_OK)
            l_message(progname, lua_pushfstring(L, "error calling 'print' (%s)",
                                                lua_tostring(L, -1)));
    }
}